

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_controller.cpp
# Opt level: O2

void __thiscall r_exec::AntiPGMController::reduce(AntiPGMController *this,View *input)

{
  mutex *__mutex;
  list<core::P<r_exec::Overlay>_> *this_00;
  pointer pcVar1;
  int iVar2;
  _iterator _Var3;
  _Object *p_Var4;
  P<r_exec::Overlay> local_48;
  const_iterator local_40;
  undefined4 extraout_var;
  
  __mutex = &(this->super__PGMController).super_OController.super_Controller.m_reductionMutex;
  std::mutex::lock(__mutex);
  this_00 = &(this->super__PGMController).super_OController.overlays;
  local_40.super__iterator._cell =
       (this->super__PGMController).super_OController.overlays.used_cells_head;
  local_40._list = this_00;
  _Var3._cell = local_40.super__iterator._cell;
LAB_001a40b6:
  do {
    if (_Var3._cell == -1) {
LAB_001a41a3:
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return;
    }
    iVar2 = (*(((local_40._list)->cells).
               super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
               ._M_impl.super__Vector_impl_data._M_start[_Var3._cell].data.object)->_vptr__Object[4]
            )();
    if ((char)iVar2 != '\0') {
      local_40 = r_code::list<core::P<r_exec::Overlay>_>::erase(this_00,&local_40);
      _Var3._cell = local_40.super__iterator._cell._cell;
      goto LAB_001a40b6;
    }
    p_Var4 = ((local_40._list)->cells).
             super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start[local_40.super__iterator._cell].data.object;
    iVar2 = (*p_Var4->_vptr__Object[3])(p_Var4,input);
    p_Var4 = (_Object *)CONCAT44(extraout_var,iVar2);
    pcVar1 = ((local_40._list)->cells).
             super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->super__PGMController).field_0x99 == '\x01') {
      p_Var4 = pcVar1[local_40.super__iterator._cell].data.object;
      (*p_Var4->_vptr__Object[2])(p_Var4);
      r_code::list<core::P<r_exec::Overlay>_>::clear(this_00);
      LOCK();
      (p_Var4->refCount).super___atomic_base<long>._M_i =
           (p_Var4->refCount).super___atomic_base<long>._M_i + 1;
      UNLOCK();
      local_48.object = p_Var4;
      r_code::list<core::P<r_exec::Overlay>_>::push_back(this_00,&local_48);
      core::P<r_exec::Overlay>::~P(&local_48);
      (this->super__PGMController).field_0x99 = 0;
      goto LAB_001a41a3;
    }
    local_40.super__iterator._cell = pcVar1[local_40.super__iterator._cell].next;
    _Var3._cell = local_40.super__iterator._cell;
    if (p_Var4 != (_Object *)0x0) {
      LOCK();
      (p_Var4->refCount).super___atomic_base<long>._M_i =
           (p_Var4->refCount).super___atomic_base<long>._M_i + 1;
      UNLOCK();
      local_48.object = p_Var4;
      r_code::list<core::P<r_exec::Overlay>_>::push_front(this_00,&local_48);
      core::P<r_exec::Overlay>::~P(&local_48);
      _Var3._cell = local_40.super__iterator._cell;
    }
  } while( true );
}

Assistant:

void AntiPGMController::reduce(r_exec::View *input)
{
    std::lock_guard<std::mutex> guard(m_reductionMutex);
    r_code::list<P<Overlay> >::const_iterator o;

    for (o = overlays.begin(); o != overlays.end();) {
        if ((*o)->is_invalidated()) {
            o = overlays.erase(o);
        } else {
            Overlay *offspring = (*o)->reduce_view(input);

            if (successful_match) { // the controller has been restarted: reset the overlay and kill all others
                Overlay *overlay = *o;
                overlay->reset();
                overlays.clear();
                overlays.push_back(overlay);
                successful_match = false;
                break;
            }

            ++o;

            if (offspring) {
                overlays.push_front(offspring);
            }
        }
    }
}